

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Result.cpp
# Opt level: O2

void __thiscall Result::Result(Result *this,Individual *individual)

{
  int *piVar1;
  vector<int,_std::allocator<int>_> *pvVar2;
  reference this_00;
  Task *pTVar3;
  int n;
  int *coreId;
  int *piVar4;
  __shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  (this->Cores).super__Vector_base<Core,_std::allocator<Core>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->usedInstance).super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->Cores).super__Vector_base<Core,_std::allocator<Core>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->Cores).super__Vector_base<Core,_std::allocator<Core>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->usedInstance).super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Individual::getUsedInstance((Individual *)&local_40);
  std::__shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->usedInstance).super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>,
             &local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  Resize(this,((this->usedInstance).super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->numProcessors);
  pvVar2 = Individual::getCoresAsignedToTasks(individual);
  piVar1 = (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  n = 0;
  for (piVar4 = (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start; piVar4 != piVar1; piVar4 = piVar4 + 1) {
    this_00 = std::vector<Core,_std::allocator<Core>_>::at(&this->Cores,(long)*piVar4);
    pTVar3 = Instance::getNthTask
                       ((this->usedInstance).
                        super___shared_ptr<Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr,n);
    Core::addtask(this_00,*pTVar3);
    n = n + 1;
  }
  calcmax(this);
  return;
}

Assistant:

Result::Result(Individual individual){
	usedInstance = individual.getUsedInstance();
	Resize(usedInstance->getNumProcessors());

	int taskId = 0;
	for(auto& coreId : individual.getCoresAsignedToTasks()){
		Cores.at(coreId).addtask( usedInstance->getNthTask(taskId) );
		taskId++;
	}

	calcmax();
}